

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_intro.c
# Opt level: O0

char * mpt_log_intro(FILE *fd,int type)

{
  int iVar1;
  char *__s;
  char *desc;
  char *reset;
  int type_local;
  FILE *fd_local;
  
  desc = (char *)0x0;
  if ((type & 0x200U) != 0) {
    iVar1 = fileno((FILE *)fd);
    iVar1 = isatty(iVar1);
    if ((iVar1 != 0) && (desc = mpt_ansi_code((uint8_t)type), desc != (char *)0x0)) {
      fputs(desc,(FILE *)fd);
      desc = mpt_ansi_reset();
    }
  }
  if ((type & 0x100U) == 0) {
    fd_local = (FILE *)desc;
  }
  else {
    __s = mpt_log_identifier(type);
    if (__s != (char *)0x0) {
      fputc(0x5b,(FILE *)fd);
      fputs(__s,(FILE *)fd);
      fputc(0x5d,(FILE *)fd);
      fputc(0x20,(FILE *)fd);
      if ((desc != (char *)0x0) && ((type & 0x400U) == 0)) {
        fputs(desc,(FILE *)fd);
        desc = (char *)0x0;
      }
    }
    if ((desc == (char *)0x0) && (__s == (char *)0x0)) {
      fputc(0x23,(FILE *)fd);
      fputc(0x20,(FILE *)fd);
    }
    fd_local = (FILE *)desc;
  }
  return (char *)fd_local;
}

Assistant:

extern const char *mpt_log_intro(FILE *fd, int type)
{
	const char *reset = 0;
	const char *desc = 0;
	
	/* change terminal color */
	if ((type & MPT_ENUM(LogSelect))
	    && isatty(fileno(fd))
	    && (reset = mpt_ansi_code(type))) {
		fputs(reset, fd);
		reset = mpt_ansi_reset();
	}
	/* no text intro */
	if (!(type & MPT_ENUM(LogPrefix))) {
		return reset;
	}
	/* print message type */
	if ((desc = mpt_log_identifier(type))) {
		fputc('[', fd);
		fputs(desc, fd);
		fputc(']', fd);
		fputc(' ', fd);
		if (reset && !(type & MPT_ENUM(LogANSIMore))) {
			fputs(reset, fd);
			reset = 0;
		}
	}
	/* no existing marking */
	if (!reset && !desc) {
		fputc('#', fd);
		fputc(' ', fd);
	}
	return reset;
}